

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aGen.hpp
# Opt level: O2

ByteCode * __thiscall ag::Generator::Get(ByteCode *__return_storage_ptr__,Generator *this)

{
  pointer pbVar1;
  pointer pvVar2;
  pointer pvVar3;
  size_t sVar4;
  long lVar5;
  bool bVar6;
  Type TVar7;
  long lVar8;
  uint16_t u;
  pointer pvVar9;
  size_t i;
  ulong uVar10;
  long lVar11;
  size_t j;
  ulong uVar12;
  vector<ag::FunctionData,_std::allocator<ag::FunctionData>_> funcs;
  long local_1f0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> methodStartAddr;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_1c8;
  ulong local_1b0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> funcStartAddr;
  string local_190;
  string local_170;
  string local_150;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_130;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_118;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  _Variant_storage<false,_char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  _Variant_storage<false,_char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  
  (__return_storage_ptr__->m_bytes).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->m_bytes).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->m_bytes).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_190,"BVM",(allocator<char> *)&funcStartAddr);
  BitConverter::GetString
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&funcs,&local_190,false);
  ByteCode::Add(__return_storage_ptr__,
                (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&funcs);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&funcs);
  std::__cxx11::string::~string((string *)&local_190);
  ByteCode::Add(__return_storage_ptr__,this->m_ver_major);
  BitConverter::GetUInt16
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&funcs,this->m_ver_minor);
  ByteCode::Add(__return_storage_ptr__,
                (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&funcs);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&funcs);
  BitConverter::GetUInt32
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&funcs,
             (uint)((ulong)((long)(this->m_strtbl).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->m_strtbl).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 5));
  ByteCode::Add(__return_storage_ptr__,
                (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&funcs);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&funcs);
  lVar8 = 0;
  for (uVar10 = 0;
      pbVar1 = (this->m_strtbl).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar10 < (ulong)((long)(this->m_strtbl).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
      uVar10 = uVar10 + 1) {
    std::__cxx11::string::string
              ((string *)&local_a0,(string *)((long)&(pbVar1->_M_dataplus)._M_p + lVar8));
    BitConverter::GetString
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&funcs,&local_a0,true);
    ByteCode::Add(__return_storage_ptr__,
                  (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&funcs);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&funcs);
    std::__cxx11::string::~string((string *)&local_a0);
    lVar8 = lVar8 + 0x20;
  }
  BitConverter::GetUInt16
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&funcs,
             (uint16_t)
             ((uint)(*(int *)&(this->m_globals).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                    *(int *)&(this->m_globals).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 5));
  ByteCode::Add(__return_storage_ptr__,
                (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&funcs);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&funcs);
  lVar8 = 0;
  for (uVar10 = 0;
      pbVar1 = (this->m_globals).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar10 < (ulong)((long)(this->m_globals).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
      uVar10 = uVar10 + 1) {
    std::__cxx11::string::string
              ((string *)&local_c0,(string *)((long)&(pbVar1->_M_dataplus)._M_p + lVar8));
    BitConverter::GetString
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&funcs,&local_c0,true);
    ByteCode::Add(__return_storage_ptr__,
                  (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&funcs);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&funcs);
    std::__cxx11::string::~string((string *)&local_c0);
    lVar8 = lVar8 + 0x20;
  }
  std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>::vector
            (&funcs,&(this->Function).m_funcs);
  funcStartAddr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  funcStartAddr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  funcStartAddr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar8 = 0;
  u = 0;
  uVar10 = 0;
  while( true ) {
    if ((ulong)(((long)funcs.super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)funcs.super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>.
                      _M_impl.super__Vector_impl_data._M_start) / 0x48) <= uVar10) break;
    bVar6 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&((funcs.
                                      super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->Object).
                                    _M_dataplus._M_p + lVar8),"");
    u = u + !bVar6;
    uVar10 = uVar10 + 1;
    lVar8 = lVar8 + 0x48;
  }
  BitConverter::GetUInt16
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&methodStartAddr,u);
  ByteCode::Add(__return_storage_ptr__,
                (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&methodStartAddr);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&methodStartAddr);
  lVar8 = 0x20;
  uVar10 = 0;
  while( true ) {
    if ((ulong)(((long)funcs.super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)funcs.super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>.
                      _M_impl.super__Vector_impl_data._M_start) / 0x48) <= uVar10) break;
    bVar6 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)funcs.
                                   super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar8 + -0x20),"");
    if (!bVar6) {
      std::__cxx11::string::string
                ((string *)&local_e0,
                 (string *)
                 ((long)&((funcs.
                           super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>.
                           _M_impl.super__Vector_impl_data._M_start)->Object)._M_dataplus._M_p +
                 lVar8));
      BitConverter::GetString
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&methodStartAddr,&local_e0
                 ,true);
      ByteCode::Add(__return_storage_ptr__,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&methodStartAddr);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&methodStartAddr);
      std::__cxx11::string::~string((string *)&local_e0);
      methodStartAddr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((__return_storage_ptr__->m_bytes).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish +
                    -(long)(__return_storage_ptr__->m_bytes).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                (&funcStartAddr,(unsigned_long *)&methodStartAddr);
      BitConverter::GetUInt32
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&methodStartAddr,0);
      ByteCode::Add(__return_storage_ptr__,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&methodStartAddr);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&methodStartAddr);
    }
    uVar10 = uVar10 + 1;
    lVar8 = lVar8 + 0x48;
  }
  ByteCode::Add(__return_storage_ptr__,
                (uint8_t)(((long)(this->m_consts).
                                 super__Vector_base<std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->m_consts).
                                super__Vector_base<std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) / 0x28));
  for (uVar10 = 0; uVar10 != 5; uVar10 = uVar10 + 1) {
    lVar8 = 0;
    bVar6 = false;
    for (uVar12 = 0;
        pvVar9 = (this->m_consts).
                 super__Vector_base<std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar12 < (ulong)(((long)(this->m_consts).
                                super__Vector_base<std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar9) / 0x28);
        uVar12 = uVar12 + 1) {
      if (uVar10 == *(byte *)((long)&(pvVar9->
                                     super__Variant_base<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     ).
                                     super__Move_assign_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
                                     .
                                     super__Copy_assign_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
                             + lVar8 + 0x20)) {
        if (!bVar6) {
          std::__detail::__variant::
          _Copy_ctor_base<false,_char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_Copy_ctor_base((_Copy_ctor_base<false,_char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&local_58,
                            (_Copy_ctor_base<false,_char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)((long)&(pvVar9->
                                       super__Variant_base<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       ).
                                       super__Move_assign_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
                                       .
                                       super__Copy_assign_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
                               + lVar8));
          TVar7 = VariantToType((agvariant *)&local_58);
          ByteCode::Add(__return_storage_ptr__,(uint8_t)TVar7);
          std::__detail::__variant::
          _Variant_storage<false,_char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~_Variant_storage(&local_58);
          pvVar9 = (this->m_consts).
                   super__Vector_base<std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        }
        std::__detail::__variant::
        _Copy_ctor_base<false,_char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_Copy_ctor_base((_Copy_ctor_base<false,_char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_80,
                          (_Copy_ctor_base<false,_char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)((long)&(pvVar9->
                                     super__Variant_base<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     ).
                                     super__Move_assign_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
                                     .
                                     super__Copy_assign_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
                             + lVar8));
        BitConverter::Get((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&methodStartAddr,
                          (agvariant *)&local_80);
        ByteCode::Add(__return_storage_ptr__,
                      (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&methodStartAddr);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&methodStartAddr);
        std::__detail::__variant::
        _Variant_storage<false,_char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~_Variant_storage(&local_80);
        bVar6 = true;
      }
      lVar8 = lVar8 + 0x28;
    }
  }
  methodStartAddr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  methodStartAddr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  methodStartAddr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  BitConverter::GetUInt16
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1c8,
             (uint16_t)
             ((uint)(*(int *)&(this->m_objNames).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                    *(int *)&(this->m_objNames).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 5));
  ByteCode::Add(__return_storage_ptr__,
                (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1c8);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_1c8);
  uVar10 = 0;
  while( true ) {
    pbVar1 = (this->m_objNames).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->m_objNames).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar10)
    break;
    std::__cxx11::string::string((string *)&local_150,(string *)(pbVar1 + uVar10));
    BitConverter::GetString
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1c8,&local_150,true);
    ByteCode::Add(__return_storage_ptr__,
                  (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1c8);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_1c8);
    std::__cxx11::string::~string((string *)&local_150);
    pvVar2 = (this->m_objProps).
             super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    BitConverter::GetUInt16
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1c8,
               (uint16_t)
               ((uint)(*(int *)((long)&pvVar2[uVar10].
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data + 8) -
                      *(int *)&pvVar2[uVar10].
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data) >> 5));
    ByteCode::Add(__return_storage_ptr__,
                  (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1c8);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_1c8);
    lVar8 = 0;
    for (uVar12 = 0;
        pvVar2 = (this->m_objProps).
                 super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        lVar11 = *(long *)&pvVar2[uVar10].
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data,
        uVar12 < (ulong)((long)*(pointer *)
                                ((long)&pvVar2[uVar10].
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data + 8) - lVar11 >> 5);
        uVar12 = uVar12 + 1) {
      std::__cxx11::string::string((string *)&local_100,(string *)(lVar11 + lVar8));
      BitConverter::GetString
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1c8,&local_100,true
                );
      ByteCode::Add(__return_storage_ptr__,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1c8);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_1c8);
      std::__cxx11::string::~string((string *)&local_100);
      lVar8 = lVar8 + 0x20;
    }
    pvVar3 = (this->m_objMethods).
             super__Vector_base<std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>,_std::allocator<std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    BitConverter::GetUInt16
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1c8,
               (uint16_t)
               (((long)*(pointer *)
                        ((long)&pvVar3[uVar10].
                                super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                ._M_impl.super__Vector_impl_data + 8) -
                *(long *)&pvVar3[uVar10].
                          super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>.
                          _M_impl.super__Vector_impl_data) / 0x48));
    ByteCode::Add(__return_storage_ptr__,
                  (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1c8);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_1c8);
    lVar8 = 0x20;
    uVar12 = 0;
    while( true ) {
      pvVar3 = (this->m_objMethods).
               super__Vector_base<std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>,_std::allocator<std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar11 = *(long *)&pvVar3[uVar10].
                         super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>.
                         _M_impl.super__Vector_impl_data;
      if ((ulong)(((long)*(pointer *)
                          ((long)&pvVar3[uVar10].
                                  super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                  ._M_impl.super__Vector_impl_data + 8) - lVar11) / 0x48) <= uVar12)
      break;
      std::__cxx11::string::string((string *)&local_170,(string *)(lVar11 + lVar8));
      BitConverter::GetString
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1c8,&local_170,true
                );
      ByteCode::Add(__return_storage_ptr__,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1c8);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_1c8);
      std::__cxx11::string::~string((string *)&local_170);
      local_1c8._M_impl.super__Vector_impl_data._M_start =
           (__return_storage_ptr__->m_bytes).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish +
           -(long)(__return_storage_ptr__->m_bytes).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                (&methodStartAddr,(unsigned_long *)&local_1c8);
      BitConverter::GetUInt32((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1c8,0)
      ;
      ByteCode::Add(__return_storage_ptr__,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1c8);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_1c8);
      uVar12 = uVar12 + 1;
      lVar8 = lVar8 + 0x48;
    }
    uVar10 = uVar10 + 1;
  }
  uVar10 = 0;
  local_1f0 = 0;
  uVar12 = 0;
  while( true ) {
    if ((ulong)(((long)funcs.super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)funcs.super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>.
                      _M_impl.super__Vector_impl_data._M_start) / 0x48) <= uVar12) break;
    bVar6 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&((funcs.
                                      super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->Object).
                                    _M_dataplus._M_p + uVar10),"");
    if (!bVar6) {
      sVar4 = funcStartAddr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start[local_1f0];
      local_1b0 = uVar10;
      BitConverter::GetUInt32
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1c8,
                 *(int *)&(__return_storage_ptr__->m_bytes).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                 *(int *)&(__return_storage_ptr__->m_bytes).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
      ByteCode::Write(__return_storage_ptr__,sVar4,
                      (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1c8);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_1c8);
      FunctionManager::Get((ByteCode *)&local_118,&this->Function,uVar12);
      uVar10 = local_1b0;
      ByteCode::Add(__return_storage_ptr__,(ByteCode *)&local_118);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_118);
      local_1f0 = local_1f0 + 1;
    }
    uVar12 = uVar12 + 1;
    uVar10 = uVar10 + 0x48;
  }
  lVar8 = 0;
  uVar10 = 0;
  while (uVar10 < (ulong)((long)(this->m_objNames).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->m_objNames).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 5)) {
    lVar11 = 0;
    local_1b0 = uVar10;
    for (uVar12 = 0;
        pvVar3 = (this->m_objMethods).
                 super__Vector_base<std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>,_std::allocator<std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar12 < (ulong)(((long)*(pointer *)
                                 ((long)&pvVar3[uVar10].
                                         super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                         ._M_impl.super__Vector_impl_data + 8) -
                         *(long *)&pvVar3[uVar10].
                                   super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                   ._M_impl.super__Vector_impl_data) / 0x48); uVar12 = uVar12 + 1) {
      sVar4 = methodStartAddr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar8];
      BitConverter::GetUInt32
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1c8,
                 *(int *)&(__return_storage_ptr__->m_bytes).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                 *(int *)&(__return_storage_ptr__->m_bytes).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
      ByteCode::Write(__return_storage_ptr__,sVar4,
                      (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1c8);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_1c8);
      lVar5 = *(long *)&(this->m_objMethods).
                        super__Vector_base<std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>,_std::allocator<std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar10].
                        super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>.
                        _M_impl.super__Vector_impl_data;
      FunctionManager::Get
                ((ByteCode *)&local_130,&this->Function,(string *)(lVar5 + lVar11 + 0x20),
                 (string *)(lVar5 + lVar11));
      ByteCode::Add(__return_storage_ptr__,(ByteCode *)&local_130);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_130);
      lVar8 = lVar8 + 1;
      lVar11 = lVar11 + 0x48;
    }
    uVar10 = local_1b0 + 1;
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&methodStartAddr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&funcStartAddr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>::~vector(&funcs);
  return __return_storage_ptr__;
}

Assistant:

inline ByteCode Get()
		{
			ByteCode bret;


			// header
			bret.Add(BitConverter::GetString(std::string("BVM"), false));


			// version
			bret.Add(m_ver_major);
			bret.Add(BitConverter::GetUInt16(m_ver_minor));


			// string table
			bret.Add(BitConverter::GetUInt32(m_strtbl.size()));
			for (size_t i = 0; i < m_strtbl.size(); i++)
				bret.Add(BitConverter::GetString(m_strtbl[i]));

			// globals
			bret.Add(BitConverter::GetUInt16(m_globals.size()));
			for (size_t i = 0; i < m_globals.size(); i++)
				bret.Add(BitConverter::GetString(m_globals[i]));	// name


															// function names
			std::vector<FunctionData> funcs = Function.GetData();
			std::vector<size_t> funcStartAddr;

			uint16_t funcCount = 0;
			for (size_t i = 0; i < funcs.size(); i++) {
				if (funcs[i].Object != "")
					continue;
				funcCount++;
			}
			bret.Add(BitConverter::GetUInt16(funcCount));

			for (size_t i = 0; i < funcs.size(); i++) {
				if (funcs[i].Object != "")
					continue;

				bret.Add(BitConverter::GetString(funcs[i].Name));
				funcStartAddr.push_back(bret.Count());
				bret.Add(BitConverter::GetUInt32(0u));
			}


			// constants
			bret.Add(m_consts.size());
			for (size_t t = 0; t < variant_type_count; t++) {
				bool written = false;
				for (size_t i = 0; i < m_consts.size(); i++) {
					if (m_consts[i].index() == t) {
						if (!written) {
							bret.Add((uint8_t)VariantToType(m_consts[i]));
							written = true;
						}
						bret.Add(BitConverter::Get(m_consts[i]));
					}
				}
			}


			// objects
			std::vector<size_t> methodStartAddr;
			bret.Add(BitConverter::GetUInt16(m_objNames.size()));
			for (size_t i = 0; i < m_objNames.size(); i++) {
				bret.Add(BitConverter::GetString(m_objNames[i]));

				bret.Add(BitConverter::GetUInt16(m_objProps[i].size()));
				for (size_t j = 0; j < m_objProps[i].size(); j++)
					bret.Add(BitConverter::GetString(m_objProps[i][j]));

				bret.Add(BitConverter::GetUInt16(m_objMethods[i].size()));
				for (size_t j = 0; j < m_objMethods[i].size(); j++) {
					bret.Add(BitConverter::GetString(m_objMethods[i][j].Name));
					methodStartAddr.push_back(bret.Count());
					bret.Add(BitConverter::GetUInt32(0u));
				}
			}


			// function code
			size_t curFunc = 0;
			for (size_t i = 0; i < funcs.size(); i++) {
				if (funcs[i].Object != "")
					continue;

				bret.Write(funcStartAddr[curFunc], BitConverter::GetUInt32(bret.Count()));
				bret.Add(Function.Get(i));
				curFunc++;
			}

			// method code
			size_t curMethod = 0;
			for (size_t i = 0; i < m_objNames.size(); i++) {
				for (size_t j = 0; j < m_objMethods[i].size(); j++) {
					bret.Write(methodStartAddr[curMethod], BitConverter::GetUInt32(bret.Count()));
					bret.Add(Function.Get(m_objMethods[i][j].Name, m_objMethods[i][j].Object));
					// TODO: method overloading
					curMethod++;
				}
			}

			return bret;
		}